

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O1

ssize_t __thiscall LASindex::read(LASindex *this,int __fd,void *__buf,size_t __nbytes)

{
  long *plVar1;
  ulong uVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  
  if (CONCAT44(in_register_00000034,__fd) != 0) {
    plVar1 = (long *)operator_new(0x28);
    plVar1[1] = 0;
    *(undefined4 *)(plVar1 + 2) = 0;
    plVar1[3] = CONCAT44(in_register_00000034,__fd);
    *plVar1 = (long)&PTR_getByte_0015e2a8;
    plVar1[4] = 0;
    uVar2 = read(this,(int)plVar1,__buf_00,0x15e2a8);
    (**(code **)(*plVar1 + 0x70))(plVar1);
    return uVar2 & 0xffffffff;
  }
  return 0;
}

Assistant:

BOOL LASindex::read(FILE* file)
{
  if (file == 0) return FALSE;
  ByteStreamIn* stream;
  if (IS_LITTLE_ENDIAN())
    stream = new ByteStreamInFileLE(file);
  else
    stream = new ByteStreamInFileBE(file);
  if (!read(stream))
  {
    delete stream;
    return FALSE;
  }
  delete stream;
  return TRUE;
}